

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

void google::protobuf::internal::WireFormat::SerializeWithCachedSizes
               (Message *message,int size,CodedOutputStream *output)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UnknownFieldSet *pUVar3;
  LogMessage *pLVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  LogFinisher local_99;
  FieldDescriptor **local_98;
  iterator iStack_90;
  FieldDescriptor **local_88;
  int local_74;
  long *local_70;
  LogMessage local_68;
  long lVar2;
  
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x17])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  local_70 = (long *)CONCAT44(extraout_var_00,iVar1);
  local_74 = (size + output->total_bytes_) - output->buffer_size_;
  local_98 = (FieldDescriptor **)0x0;
  iStack_90._M_current = (FieldDescriptor **)0x0;
  local_88 = (FieldDescriptor **)0x0;
  if (*(char *)(*(long *)(lVar2 + 0x20) + 0x6b) == '\x01') {
    if (0 < *(int *)(lVar2 + 0x2c)) {
      lVar5 = 0;
      lVar7 = 0;
      do {
        local_68._0_8_ = *(long *)(lVar2 + 0x30) + lVar5;
        if (iStack_90._M_current == local_88) {
          std::
          vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
          ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*>
                    ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                      *)&local_98,iStack_90,(FieldDescriptor **)&local_68);
        }
        else {
          *iStack_90._M_current = (FieldDescriptor *)local_68._0_8_;
          iStack_90._M_current = iStack_90._M_current + 1;
        }
        lVar7 = lVar7 + 1;
        lVar5 = lVar5 + 0xa8;
      } while (lVar7 < *(int *)(lVar2 + 0x2c));
    }
  }
  else {
    (**(code **)(*local_70 + 0x80))(local_70,message,&local_98);
  }
  if (iStack_90._M_current != local_98) {
    uVar6 = 0;
    do {
      SerializeFieldWithCachedSizes(local_98[uVar6],message,output);
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)iStack_90._M_current - (long)local_98 >> 3));
  }
  if (*(char *)(*(long *)(lVar2 + 0x20) + 0x68) == '\0') {
    pUVar3 = (UnknownFieldSet *)(**(code **)(*local_70 + 0x10))(local_70,message);
    SerializeUnknownFields(pUVar3,output);
  }
  else {
    pUVar3 = (UnknownFieldSet *)(**(code **)(*local_70 + 0x10))(local_70,message);
    SerializeUnknownMessageSetItems(pUVar3,output);
  }
  if (output->total_bytes_ - output->buffer_size_ != local_74) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x33e);
    pLVar4 = LogMessage::operator<<
                       (&local_68,"CHECK failed: (output->ByteCount()) == (expected_endpoint): ");
    pLVar4 = LogMessage::operator<<
                       (pLVar4,
                        ": Protocol message serialized to a size different from what was originally expected.  Perhaps it was modified by another thread during serialization?"
                       );
    LogFinisher::operator=(&local_99,pLVar4);
    LogMessage::~LogMessage(&local_68);
  }
  if (local_98 != (FieldDescriptor **)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  return;
}

Assistant:

void WireFormat::SerializeWithCachedSizes(
    const Message& message,
    int size, io::CodedOutputStream* output) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* message_reflection = message.GetReflection();
  int expected_endpoint = output->ByteCount() + size;

  std::vector<const FieldDescriptor*> fields;

  // Fields of map entry should always be serialized.
  if (descriptor->options().map_entry()) {
    for (int i = 0; i < descriptor->field_count(); i++) {
      fields.push_back(descriptor->field(i));
    }
  } else {
    message_reflection->ListFields(message, &fields);
  }

  for (int i = 0; i < fields.size(); i++) {
    SerializeFieldWithCachedSizes(fields[i], message, output);
  }

  if (descriptor->options().message_set_wire_format()) {
    SerializeUnknownMessageSetItems(
        message_reflection->GetUnknownFields(message), output);
  } else {
    SerializeUnknownFields(
        message_reflection->GetUnknownFields(message), output);
  }

  GOOGLE_CHECK_EQ(output->ByteCount(), expected_endpoint)
    << ": Protocol message serialized to a size different from what was "
       "originally expected.  Perhaps it was modified by another thread "
       "during serialization?";
}